

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

ON_wString __thiscall ON_Annotation::PlainText(ON_Annotation *this)

{
  int iVar1;
  ON_Geometry *in_RSI;
  ON_BoundingBox local_50;
  ON_TextRunArray *local_20;
  ON_TextRunArray *runs;
  ON_Annotation *this_local;
  
  this_local = this;
  if (in_RSI[0xb].super_ON_Object.m_userdata_list == (ON_UserData *)0x0) {
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
  }
  else {
    local_20 = ON_TextContent::TextRuns
                         ((ON_TextContent *)in_RSI[0xb].super_ON_Object.m_userdata_list,true);
    if (local_20 != (ON_TextRunArray *)0x0) {
      iVar1 = ON_TextRunArray::Count(local_20);
      if (iVar1 == 0) {
        ON_Geometry::BoundingBox(&local_50,in_RSI);
      }
    }
    ON_TextContent::PlainText((ON_TextContent *)this);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_Annotation::PlainText() const
{
  if (nullptr == m_text)
    return ON_wString::EmptyString;
  const ON_TextRunArray* runs = m_text->TextRuns(true);
  if (nullptr != runs && 0 == runs->Count())
    BoundingBox();  // Side effect of building text runs
  return m_text->PlainText();
}